

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsUtils.cpp
# Opt level: O3

double nearestPowerOfTwoScale(double value)

{
  undefined8 in_RAX;
  int __exponent;
  double dVar1;
  int local_14;
  
  local_14 = (int)((ulong)in_RAX >> 0x20);
  dVar1 = frexp(value,&local_14);
  __exponent = local_14 - (uint)(ABS(dVar1) == 0.5);
  ldexp(1.0,__exponent);
  dVar1 = ldexp(1.0,-__exponent);
  return dVar1;
}

Assistant:

double nearestPowerOfTwoScale(const double value) {
  int exp_scale;
  // Decompose value into a normalized fraction and an integral power
  // of two.
  //
  // If arg is zero, returns zero and stores zero in *exp. Otherwise
  // (if arg is not zero), if no errors occur, returns the value x in
  // the range (-1;-0.5], [0.5; 1) and stores an integer value in *exp
  // such that x×2(*exp)=arg
  double check_x = std::frexp(value, &exp_scale);
  if (std::fabs(check_x) == 0.5) {
    check_x *= 2;
    exp_scale--;
  }
  const double check_value = check_x * std::pow(2, exp_scale);
  assert(check_value == value);
  exp_scale = -exp_scale;
  // Multiply a floating point value x(=1) by the number 2 raised to
  // the exp power
  double scale = std::ldexp(1, exp_scale);
  return scale;
}